

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_DBIStream.cpp
# Opt level: O1

GlobalSymbolStream * __thiscall
PDB::DBIStream::CreateGlobalSymbolStream
          (GlobalSymbolStream *__return_storage_ptr__,DBIStream *this,RawFile *file)

{
  HashTableHeader data;
  DirectMSFStream globalStream;
  undefined1 auStack_58 [8];
  uint local_50;
  DirectMSFStream local_48;
  
  RawFile::CreateMSFStream<PDB::DirectMSFStream>
            (&local_48,file,(uint)(this->m_header).globalStreamIndex);
  DirectMSFStream::ReadAtOffset(&local_48,auStack_58,0x10,0);
  GlobalSymbolStream::GlobalSymbolStream
            (__return_storage_ptr__,file,(this->m_header).globalStreamIndex,local_50 >> 3);
  return __return_storage_ptr__;
}

Assistant:

PDB_NO_DISCARD PDB::GlobalSymbolStream PDB::DBIStream::CreateGlobalSymbolStream(const RawFile& file) const PDB_NO_EXCEPT
{
	DirectMSFStream globalStream = file.CreateMSFStream<DirectMSFStream>(m_header.globalStreamIndex);

	// the global symbol stream starts with a hash table header.
	// we use this to work out how many symbol records are referenced by the global symbol stream.
	const HashTableHeader hashHeader = globalStream.ReadAtOffset<HashTableHeader>(0u);
	const uint32_t recordCount = hashHeader.size / sizeof(HashRecord);

	return GlobalSymbolStream(file, m_header.globalStreamIndex, recordCount);
}